

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

void canvas_doclick(_glist *x,int xpos,int ypos,int which,int mod,int doit)

{
  undefined1 *puVar1;
  _rtext *p_Var2;
  double dVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  t_object *ptVar10;
  t_text *y;
  t_gobj *ptVar11;
  _glist *p_Var12;
  _outconnect *oc;
  t_selection *ptVar13;
  _rtext *p_Var14;
  t_editor *ptVar15;
  t_gobj *ptVar16;
  void *data;
  byte bVar17;
  _instanceeditor *p_Var18;
  undefined4 in_register_00000014;
  int iVar19;
  undefined4 uVar20;
  int iVar21;
  int iVar22;
  uint shift;
  ulong uVar23;
  bool bVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  int x1;
  undefined8 local_f8;
  ulong local_f0;
  int y1;
  ulong local_e0;
  int y2;
  int x2;
  t_float local_d0;
  float local_cc;
  undefined1 local_c8 [16];
  float local_b8;
  t_linetraverser t;
  
  x1 = 0;
  y1 = 0;
  x2 = 0;
  y2 = 0;
  ptVar15 = x->gl_editor;
  if (ptVar15 == (t_editor *)0x0) {
    bug("editor");
    return;
  }
  uVar23 = (ulong)(uint)mod;
  bVar24 = true;
  if ((which & 2U) == 0) {
    bVar24 = (x->field_0xe8 & 0x20) == 0;
  }
  p_Var18 = (pd_maininstance.pd_gui)->i_editor;
  *(undefined4 *)(p_Var18 + 0x40) = 0;
  if (mod == 0) {
    uVar20 = 1;
    local_f8 = 0;
    bVar17 = 0xf7;
  }
  else {
    if ((ptVar15->e_grab != (t_gobj *)0x0) && (ptVar15->e_keyfn != (t_glistkeyfn)0x0)) {
      (*ptVar15->e_keyfn)(ptVar15->e_grab,&s_,0.0);
      ptVar11 = x->gl_editor->e_grab;
      if ((ptVar11 != (t_gobj *)0x0) &&
         ((ptVar10 = pd_checkobject(&ptVar11->g_pd), ptVar10 != (t_object *)0x0 &&
          ((~ptVar10->field_0x2e & 3) == 0)))) {
        gatom_undarken(ptVar10);
      }
      glist_grab(x,(t_gobj *)0x0,(t_glistmotionfn)0x0,(t_glistkeyfn)0x0,0,0);
      p_Var18 = (pd_maininstance.pd_gui)->i_editor;
    }
    local_f8 = 0;
    uVar20 = 1;
    if ((*(int *)(p_Var18 + 0x50) == xpos) && (*(int *)(p_Var18 + 0x54) == ypos)) {
      dVar3 = sys_getrealtime();
      uVar20 = 1;
      if (dVar3 - *(double *)((pd_maininstance.pd_gui)->i_editor + 0x48) < 0.25) {
        local_f8 = 1;
        uVar20 = 3;
      }
    }
    puVar1 = &x->gl_editor->field_0x88;
    *puVar1 = *puVar1 & 0xf7;
    ptVar15 = x->gl_editor;
    ptVar15->e_grab = (t_gobj *)0x0;
    bVar17 = 0xf8;
  }
  ptVar15->field_0x88 = ptVar15->field_0x88 & bVar17;
  ptVar15 = x->gl_editor;
  if ((ptVar15->field_0x88 & 7) != 0) {
    return;
  }
  shift = which & 1;
  ptVar15->e_xwas = xpos;
  ptVar15->e_ywas = ypos;
  local_f0 = uVar23;
  if (bVar24 && (char)((which & 8U) >> 3) == '\0') {
    if (ptVar15->e_textedfor != (_rtext *)0x0 && mod != 0) {
      local_f0 = CONCAT44(local_f0._4_4_,uVar20);
      y = rtext_getowner(ptVar15->e_textedfor);
      iVar5 = canvas_hitbox(x,&y->te_g,xpos,ypos,&x1,&y1,&x2,&y2);
      iVar8 = y1;
      iVar6 = x1;
      p_Var2 = x->gl_editor->e_textedfor;
      if (iVar5 != 0) {
        iVar5 = 4;
        if (shift == 0) {
          iVar5 = (int)(t_float)local_f0;
        }
        rtext_mouse(p_Var2,xpos - x1,ypos - y1,iVar5);
        x->gl_editor->field_0x88 = x->gl_editor->field_0x88 & 0xf8 | 5;
        ptVar15 = x->gl_editor;
        ptVar15->e_xwas = iVar6;
        ptVar15->e_ywas = iVar8;
        return;
      }
      rtext_retext(p_Var2);
      rtext_activate(x->gl_editor->e_textedfor,0);
      return;
    }
    ptVar11 = x->gl_list;
    if (ptVar11 != (t_gobj *)0x0) {
      do {
        iVar6 = canvas_hitbox(x,ptVar11,xpos,ypos,&x1,&y1,&x2,&y2);
        if (iVar6 != 0) {
          if (((which & 2U) == 0) || (uVar7 = 1, (x->field_0xe8 & 0x20) != 0)) {
            uVar7 = (which & 4U) >> 2;
          }
          uVar7 = gobj_click(ptVar11,x,xpos,ypos,shift,uVar7,(int)local_f8,(int)local_f0);
          if (uVar7 != 0) {
            if ((t_float)local_f0 != 0.0) {
              return;
            }
            goto LAB_0013ff6d;
          }
        }
        ptVar11 = ptVar11->g_next;
      } while (ptVar11 != (_gobj *)0x0);
    }
    if ((t_float)local_f0 != 0.0) {
      return;
    }
  }
  else {
    local_f0 = CONCAT44(local_f0._4_4_,uVar20);
    local_f8 = CONCAT44(in_register_00000014,ypos);
    local_e0 = (ulong)(uint)xpos;
    ptVar11 = canvas_findhitbox(x,xpos,ypos,&x1,&y1,&x2,&y2);
    if (ptVar11 != (t_gobj *)0x0) {
      ptVar10 = pd_checkobject(&ptVar11->g_pd);
      iVar5 = x2;
      iVar8 = (int)local_f8;
      iVar6 = (int)local_e0;
      if ((which & 8U) != 0) {
        canvas_rightclick(x,iVar6,iVar8,ptVar11);
        return;
      }
      if (shift == 0) {
        if ((x2 + -4 <= iVar6) && (ptVar10 != (t_object *)0x0 && iVar8 < y2 + -4)) {
          if ((((ptVar10->te_g).g_pd)->c_wb != &text_widgetbehavior) &&
             ((~ptVar10->field_0x2e & 3) != 0)) {
            p_Var12 = pd_checkglist((t_pd *)ptVar10);
            iVar6 = (int)local_e0;
            iVar8 = (int)local_f8;
            if (p_Var12 == (_glist *)0x0) goto LAB_0013fffe;
          }
          if (mod != 0) {
            ptVar15 = x->gl_editor;
            if (ptVar15 != (t_editor *)0x0) {
              for (ptVar13 = ptVar15->e_selection; ptVar13 != (t_selection *)0x0;
                  ptVar13 = ptVar13->sel_next) {
                if (ptVar13->sel_what == ptVar11) goto LAB_0014019e;
              }
            }
            glist_noselect(x);
            glist_select(x,ptVar11);
            iVar6 = (int)local_e0;
            iVar8 = (int)local_f8;
            ptVar15 = x->gl_editor;
LAB_0014019e:
            ptVar15->field_0x88 = ptVar15->field_0x88 & 0xf8 | 6;
            ptVar15 = x->gl_editor;
            ptVar15->e_xwas = x1;
            ptVar15->e_ywas = y1;
            ptVar15->e_xnew = iVar6;
            ptVar15->e_ynew = iVar8;
            ptVar16 = x->gl_list;
            iVar6 = 0;
            if (ptVar16 != ptVar11 && ptVar16 != (t_gobj *)0x0) {
              iVar6 = 0;
              do {
                iVar6 = iVar6 + 1;
                ptVar16 = ptVar16->g_next;
                if (ptVar16 == (_gobj *)0x0) break;
              } while (ptVar16 != ptVar11);
            }
            data = canvas_undo_set_apply(x,iVar6);
            canvas_undo_add(x,UNDO_APPLY,"resize",data);
            return;
          }
          uVar7 = 7;
          goto LAB_0013ff6d;
        }
        if (ptVar10 == (t_object *)0x0) {
          if (mod == 0) goto LAB_00140151;
LAB_00140101:
          ptVar15 = x->gl_editor;
          if (ptVar15 != (t_editor *)0x0) goto LAB_0014010d;
        }
        else {
LAB_0013fffe:
          iVar6 = obj_noutlets(ptVar10);
          uVar23 = local_e0;
          uVar4 = local_f8;
          if (iVar6 != 0) {
            iVar8 = x->gl_zoom;
            iVar22 = (int)local_f8;
            if (y2 + iVar8 * -2 <= iVar22) {
              iVar5 = iVar5 - x1;
              iVar21 = 1;
              if (1 < iVar6) {
                iVar21 = iVar6 + -1;
              }
              iVar19 = (int)local_e0;
              iVar9 = (iVar5 / 2 + (iVar19 - x1) * iVar21) / iVar5;
              if (((iVar9 < iVar6) &&
                  (iVar6 = ((iVar8 * -7 + iVar5) * iVar9) / iVar21 + x1, iVar6 - iVar8 <= iVar19))
                 && (iVar19 <= iVar6 + iVar8 * 8)) {
                if (mod != 0) {
                  iVar6 = obj_issignaloutlet(ptVar10,iVar9);
                  x->gl_editor->field_0x88 = x->gl_editor->field_0x88 & 0xf8 | 2;
                  ptVar15 = x->gl_editor;
                  ptVar15->e_xwas = iVar19;
                  ptVar15->e_ywas = iVar22;
                  pdgui_vmess("::pdtk_canvas::cords_to_foreground","ci",x,0);
                  pdgui_vmess((char *)0x0,"crr iiii ri rs",x,"create","line",uVar23 & 0xffffffff,
                              uVar4,uVar23,uVar4,"-width",(ulong)(uint)(x->gl_zoom << (iVar6 != 0)),
                              "-tags","x");
                  return;
                }
                uVar7 = 5;
                goto LAB_0013ff6d;
              }
            }
          }
          if (mod == 0) {
LAB_00140151:
            uVar7 = 4;
            goto LAB_0013ff6d;
          }
          ptVar15 = x->gl_editor;
          p_Var2 = ptVar15->e_textedfor;
          if (p_Var2 != (_rtext *)0x0) {
            p_Var14 = glist_findrtext(x,ptVar10);
            iVar8 = y1;
            iVar6 = x1;
            if (p_Var2 == p_Var14) {
              rtext_mouse(p_Var2,(int)local_e0 - x1,(int)local_f8 - y1,(int)(t_float)local_f0);
              x->gl_editor->field_0x88 = x->gl_editor->field_0x88 & 0xf8 | 5;
              ptVar15 = x->gl_editor;
              ptVar15->e_xwas = iVar6;
              ptVar15->e_ywas = iVar8;
              return;
            }
            goto LAB_00140101;
          }
LAB_0014010d:
          for (ptVar13 = ptVar15->e_selection; ptVar13 != (t_selection *)0x0;
              ptVar13 = ptVar13->sel_next) {
            if (ptVar13->sel_what == ptVar11) goto LAB_0014013b;
          }
        }
        glist_noselect(x);
        glist_select(x,ptVar11);
        ptVar15 = x->gl_editor;
LAB_0014013b:
        bVar17 = (ptVar15->field_0x88 & 0xf8) + 1;
LAB_00140146:
        ptVar15->field_0x88 = bVar17;
        return;
      }
      if (mod == 0) {
        return;
      }
      if (ptVar10 == (t_object *)0x0) {
LAB_0013ffbf:
        ptVar15 = x->gl_editor;
        if (ptVar15 == (t_editor *)0x0) goto LAB_00140037;
      }
      else {
        ptVar15 = x->gl_editor;
        p_Var2 = ptVar15->e_textedfor;
        if (p_Var2 != (_rtext *)0x0) {
          p_Var14 = glist_findrtext(x,ptVar10);
          iVar8 = y1;
          iVar6 = x1;
          if (p_Var2 == p_Var14) {
            rtext_mouse(p_Var2,(int)local_e0 - x1,(int)local_f8 - y1,4);
            x->gl_editor->field_0x88 = x->gl_editor->field_0x88 & 0xf8 | 5;
            ptVar15 = x->gl_editor;
            ptVar15->e_xwas = iVar6;
            ptVar15->e_ywas = iVar8;
            return;
          }
          goto LAB_0013ffbf;
        }
      }
      for (ptVar13 = ptVar15->e_selection; ptVar13 != (t_selection *)0x0;
          ptVar13 = ptVar13->sel_next) {
        if (ptVar13->sel_what == ptVar11) {
          glist_deselect(x,ptVar11);
          return;
        }
      }
LAB_00140037:
      glist_select(x,ptVar11);
      return;
    }
    if ((which & 8U) == 0) {
      if (!bVar24) {
        if ((which & 4U) == 0) {
          local_f0 = uVar23;
          p_Var12 = glist_getcanvas((_glist *)0x0);
          linetraverser_start(&t,p_Var12);
          oc = linetraverser_next(&t);
          if (oc != (_outconnect *)0x0) {
            local_b8 = (float)(int)(t_float)local_e0;
            local_c8 = ZEXT416((uint)(float)(int)local_f8);
            do {
              fVar25 = (float)t.tr_lx2 - (float)t.tr_lx1;
              fVar26 = (float)local_c8._0_4_ - (float)t.tr_ly1;
              fVar27 = local_b8 - (float)t.tr_lx1;
              fVar28 = (float)t.tr_ly2 - (float)t.tr_ly1;
              fVar29 = fVar25 * fVar26 + fVar27 * -fVar28;
              if (((fVar29 * fVar29 < (fVar25 * fVar25 + fVar28 * fVar28) * 50.0) &&
                  (0.0 <= fVar27 * fVar25 + fVar26 * fVar28)) &&
                 (0.0 <= ((float)t.tr_lx2 - local_b8) * fVar25 +
                         ((float)t.tr_ly2 - (float)local_c8._0_4_) * fVar28)) {
                iVar6 = canvas_getindex(p_Var12,&(t.tr_ob)->te_g);
                iVar8 = canvas_getindex(p_Var12,&(t.tr_ob2)->te_g);
                if (shift == 0) {
                  if ((t_float)local_f0 == 0.0) goto LAB_0014053b;
                  glist_noselect(x);
                }
                else {
                  ptVar15 = x->gl_editor;
                  if ((ptVar15->field_0x88 & 0x20) != 0) {
                    iVar5 = ptVar15->e_selectline_index1;
                    iVar22 = ptVar15->e_selectline_outno;
                    iVar21 = ptVar15->e_selectline_index2;
                    iVar9 = ptVar15->e_selectline_inno;
                    if (((iVar6 == iVar5) && (iVar8 == iVar21)) &&
                       ((iVar22 == t.tr_outno && (iVar9 == t.tr_inno)))) {
                      if ((t_float)local_f0 != 0.0) {
                        ptVar15->field_0x88 = ptVar15->field_0x88 & 0xdf;
                        _editor_selectlinecolor(x,"black");
                      }
                      goto LAB_0014053b;
                    }
                    if ((ptVar15->e_selection == (t_selection *)0x0) &&
                       (iVar6 == iVar5 || iVar8 == iVar21)) {
                      local_f8 = CONCAT44(local_f8._4_4_,iVar8);
                      if ((t_float)local_f0 != 0.0) {
                        canvas_undo_add(x,UNDO_SEQUENCE_START,"reconnect",(void *)0x0);
                        local_f0 = CONCAT44(local_f0._4_4_,(float)iVar5);
                        local_e0 = CONCAT44(local_e0._4_4_,(float)iVar22);
                        local_b8 = (float)iVar21;
                        fVar25 = (float)iVar9;
                        local_c8._0_4_ = fVar25;
                        canvas_disconnect_with_undo(x,(float)iVar5,(float)iVar22,local_b8,fVar25);
                        local_d0 = (t_float)iVar6;
                        iVar6 = (int)local_f8;
                        local_cc = (float)(int)local_f8;
                        canvas_disconnect_with_undo
                                  (x,local_d0,(float)t.tr_outno,local_cc,(float)t.tr_inno);
                        canvas_connect_with_undo
                                  (x,local_d0,(float)t.tr_outno,local_b8,(t_float)local_c8._0_4_);
                        canvas_connect_with_undo
                                  (x,(t_float)local_f0,(t_float)local_e0,local_cc,(float)t.tr_inno);
                        canvas_undo_add(x,UNDO_SEQUENCE_END,"reconnect",(void *)0x0);
                        ptVar15 = x->gl_editor;
                        ptVar15->e_selectline_index1 = iVar5;
                        ptVar15->e_selectline_outno = iVar22;
                        ptVar15->e_selectline_index2 = iVar6;
                        ptVar15->e_selectline_inno = t.tr_inno;
                        canvas_dirty(x,1.0);
                      }
                      goto LAB_0014053b;
                    }
                    goto LAB_0013fe33;
                  }
                  if ((t_float)local_f0 == 0.0) goto LAB_0014053b;
                }
                glist_selectline(p_Var12,oc,iVar6,t.tr_outno,iVar8,t.tr_inno);
LAB_0014053b:
                canvas_setcursor(x,6);
                return;
              }
LAB_0013fe33:
              oc = linetraverser_next(&t);
            } while (oc != (_outconnect *)0x0);
          }
          mod = (int)local_f0;
        }
        canvas_setcursor(x,4);
        if (mod == 0) {
          return;
        }
        if (shift == 0) {
          glist_noselect(x);
        }
        uVar4 = local_f8;
        iVar6 = (int)local_e0;
        pdgui_vmess((char *)0x0,"crr iiii rs",x,"create","rectangle",local_e0 & 0xffffffff,local_f8,
                    local_e0,local_f8,"-tags","x");
        ptVar15 = x->gl_editor;
        ptVar15->e_xwas = iVar6;
        ptVar15->e_ywas = (int)uVar4;
        bVar17 = ptVar15->field_0x88 & 0xf8 | 3;
        goto LAB_00140146;
      }
    }
    else {
      pdgui_vmess("pdtk_canvas_popup","^ ii ii",x,local_e0,local_f8,1,0);
    }
  }
  uVar7 = 0;
LAB_0013ff6d:
  canvas_setcursor(x,uVar7);
  return;
}

Assistant:

static void canvas_doclick(t_canvas *x, int xpos, int ypos, int which,
    int mod, int doit)
{
    t_gobj *hitbox;
    int shiftmod, runmode, altmod, doublemod = 0, rightclick;
    int x1=0, y1=0, x2=0, y2=0, clickreturned = 0;
    t_text *hitobj;

    if (!x->gl_editor)
    {
        bug("editor");
        return;
    }

    shiftmod = (mod & SHIFTMOD);
    runmode = ((mod & CTRLMOD) || (!x->gl_edit));
    altmod = (mod & ALTMOD);
    rightclick = (mod & RIGHTCLICK);

    EDITOR->canvas_undo_already_set_move = 0;

        /* if keyboard was grabbed, notify grabber and cancel the grab */
    if (doit && x->gl_editor->e_grab && x->gl_editor->e_keyfn)
    {
        (* x->gl_editor->e_keyfn) (x->gl_editor->e_grab, &s_, 0);
        undarken_if_gatom(x->gl_editor->e_grab);
        glist_grab(x, 0, 0, 0, 0, 0);
    }

    if (doit && xpos == EDITOR->canvas_upx &&
        ypos == EDITOR->canvas_upy &&
        sys_getrealtime() - EDITOR->canvas_upclicktime < DCLICKINTERVAL)
            doublemod = 1;
    x->gl_editor->e_lastmoved = 0;
    if (doit)
    {
        x->gl_editor->e_grab = 0;
        x->gl_editor->e_onmotion = MA_NONE;
    }
#if 0
    post("click %d %d %d %d", xpos, ypos, which, mod);
#endif

    if (x->gl_editor->e_onmotion != MA_NONE)
        return;

    x->gl_editor->e_xwas = xpos;
    x->gl_editor->e_ywas = ypos;

    if (runmode && !rightclick)
    {
            /* is a text activated ? */
        if (x->gl_editor->e_textedfor  && doit)
        {
            hitobj = rtext_getowner(x->gl_editor->e_textedfor);
            if (canvas_hitbox(x, &hitobj->te_g,
                xpos, ypos, &x1, &y1, &x2, &y2))
            {
                rtext_mouse(x->gl_editor->e_textedfor, xpos - x1, ypos - y1,
                    (shiftmod? RTEXT_SHIFT :
                        (doublemod ? RTEXT_DBL : RTEXT_DOWN)));
                    x->gl_editor->e_onmotion = MA_DRAGTEXT;
                    x->gl_editor->e_xwas = x1;
                    x->gl_editor->e_ywas = y1;
            }
            else
            {
                rtext_retext(x->gl_editor->e_textedfor);
                rtext_activate(x->gl_editor->e_textedfor, 0);
            }
            return;
        }
        for (hitbox = x->gl_list; hitbox; hitbox = hitbox->g_next)
        {
                /* check if the object wants to be clicked */
            if (canvas_hitbox(x, hitbox, xpos, ypos, &x1, &y1, &x2, &y2)
                && (clickreturned = gobj_click(hitbox, x, xpos, ypos,
                    shiftmod, ((mod & CTRLMOD) && (!x->gl_edit)) || altmod,
                        doublemod, doit)))
                            break;
        }
        if (!doit)
        {
            if (hitbox)
                canvas_setcursor(x, clickreturned);
            else canvas_setcursor(x, CURSOR_RUNMODE_NOTHING);
        }
        return;
    }
        /* if not a runmode left click, fall here. */
    hitbox = canvas_findhitbox(x, xpos, ypos, &x1, &y1, &x2, &y2);
    hitobj = (hitbox ? pd_checkobject(&hitbox->g_pd) : 0);
        /* if text is activated while we're in locked state, this must
        be a number box - so if we clicked outside the box, deactivate it.
        This is a different situation from the "deselect" action below
        when we're unlocked.  */
    /* if (doit) post("%d %x %x %x", x->gl_edit, x->gl_editor->e_textedfor,
        hitobj, (hitobj ? glist_findrtext(x, hitobj) : 0));
    if (doit && (!x->gl_edit) && x->gl_editor->e_textedfor &&
        (!hitobj || (glist_findrtext(x, hitobj) != x->gl_editor->e_textedfor)))
            rtext_activate(x->gl_editor->e_textedfor, 0);   */
    if (hitbox)
    {
            /* we're in a rectangle */
        if (rightclick)
            canvas_rightclick(x, xpos, ypos, hitbox);
        else if (shiftmod)
        {
            if (doit)
            {
                t_rtext *rt;
                if (hitobj && (rt = x->gl_editor->e_textedfor) &&
                    rt == glist_findrtext(x, hitobj))
                {
                    rtext_mouse(rt, xpos - x1, ypos - y1, RTEXT_SHIFT);
                    x->gl_editor->e_onmotion = MA_DRAGTEXT;
                    x->gl_editor->e_xwas = x1;
                    x->gl_editor->e_ywas = y1;
                }
                else
                {
                    if (glist_isselected(x, hitbox))
                        glist_deselect(x, hitbox);
                    else glist_select(x, hitbox);
                }
            }
        }
        else
        {
            int noutlet;
                /* resize? only for "true" text boxes or canvases */
            if (xpos >= x2-4 && ypos < y2-4 && hitobj &&
                    (hitobj->te_pd->c_wb == &text_widgetbehavior ||
                    hitobj->te_type == T_ATOM ||
                    pd_checkglist(&hitobj->te_pd)))
            {
                if (doit)
                {
                    if (!glist_isselected(x, hitbox))
                    {
                        glist_noselect(x);
                        glist_select(x, hitbox);
                    }
                    x->gl_editor->e_onmotion = MA_RESIZE;
                    x->gl_editor->e_xwas = x1;
                    x->gl_editor->e_ywas = y1;
                    x->gl_editor->e_xnew = xpos;
                    x->gl_editor->e_ynew = ypos;
                    canvas_undo_add(x, UNDO_APPLY, "resize",
                        canvas_undo_set_apply(x, glist_getindex(x, hitbox)));
                }
                else canvas_setcursor(x, CURSOR_EDITMODE_RESIZE);
            }
                /* look for an outlet */
            else if (hitobj && (noutlet = obj_noutlets(hitobj)) &&
                ypos >= y2 - (OHEIGHT*x->gl_zoom) + x->gl_zoom)
            {
                int width = x2 - x1;
                int iow = IOWIDTH * x->gl_zoom;
                int nout1 = (noutlet > 1 ? noutlet - 1 : 1);
                int closest = ((xpos-x1) * (nout1) + width/2)/width;
                int hotspot = x1 +
                    (width - iow) * closest / (nout1);
                if (closest < noutlet &&
                    xpos >= (hotspot - x->gl_zoom) &&
                    xpos <= hotspot + (iow + x->gl_zoom))
                {
                    if (doit)
                    {
                        int issignal = obj_issignaloutlet(hitobj, closest);
                        x->gl_editor->e_onmotion = MA_CONNECT;
                        x->gl_editor->e_xwas = xpos;
                        x->gl_editor->e_ywas = ypos;
                        pdgui_vmess("::pdtk_canvas::cords_to_foreground", "ci", x, 0);
                        pdgui_vmess(0, "crr iiii ri rs",
                            x, "create", "line",
                            xpos,ypos, xpos,ypos,
                            "-width", (issignal ? 2 : 1) * x->gl_zoom,
                            "-tags", "x");
                    }
                    else canvas_setcursor(x, CURSOR_EDITMODE_CONNECT);
                }
                else if (doit)
                    goto nooutletafterall;
                else canvas_setcursor(x, CURSOR_EDITMODE_NOTHING);
            }
                /* not in an outlet; select and move */
            else if (doit)
            {
                t_rtext *rt;
                    /* check if the box is being text edited */
            nooutletafterall:
                if (hitobj && (rt = x->gl_editor->e_textedfor) &&
                    rt == glist_findrtext(x, hitobj))
                {
                    rtext_mouse(rt, xpos - x1, ypos - y1,
                        (doublemod ? RTEXT_DBL : RTEXT_DOWN));
                    x->gl_editor->e_onmotion = MA_DRAGTEXT;
                    x->gl_editor->e_xwas = x1;
                    x->gl_editor->e_ywas = y1;
                }
                else
                {
                        /* otherwise select and drag to displace */
                    if (!glist_isselected(x, hitbox))
                    {
                        glist_noselect(x);
                        glist_select(x, hitbox);
                    }
                    x->gl_editor->e_onmotion = MA_MOVE;
                }
            }
            else canvas_setcursor(x, CURSOR_EDITMODE_NOTHING);
        }
        return;
    }
        /* if right click doesn't hit any boxes, call rightclick
           routine anyway */
    if (rightclick)
        canvas_rightclick(x, xpos, ypos, 0);

        /* if not an editing action, and if we didn't hit a
           box, set cursor and return */
    if (runmode || rightclick)
    {
        canvas_setcursor(x, CURSOR_RUNMODE_NOTHING);
        return;
    }
        /* having failed to find a box, we try lines now. */
    if (!runmode && !altmod)
    {
        t_linetraverser t;
        t_outconnect *oc;
        t_float fx = xpos, fy = ypos;
        t_glist *glist2 = glist_getcanvas(x);
        linetraverser_start(&t, glist2);
        while ((oc = linetraverser_next(&t)))
        {
            int outindex, inindex;
            t_float lx1 = t.tr_lx1, ly1 = t.tr_ly1,
                lx2 = t.tr_lx2, ly2 = t.tr_ly2;
            t_float area = (lx2 - lx1) * (fy - ly1) -
                (ly2 - ly1) * (fx - lx1);
            t_float dsquare = (lx2-lx1) * (lx2-lx1) + (ly2-ly1) * (ly2-ly1);
            if (area * area >= 50 * dsquare) continue;
            if ((lx2-lx1) * (fx-lx1) + (ly2-ly1) * (fy-ly1) < 0) continue;
            if ((lx2-lx1) * (lx2-fx) + (ly2-ly1) * (ly2-fy) < 0) continue;
            outindex = canvas_getindex(glist2, &t.tr_ob->ob_g);
            inindex = canvas_getindex(glist2, &t.tr_ob2->ob_g);
            if (shiftmod)
            {
                int soutindex, sinindex, soutno, sinno;
                    /* if no line is selected, just add this line to the selection */
                if(!x->gl_editor->e_selectedline)
                {
                    if (doit)
                    {
                        glist_selectline(glist2, oc,
                            outindex, t.tr_outno,
                            inindex, t.tr_inno);
                    }
                    canvas_setcursor(x, CURSOR_EDITMODE_DISCONNECT);
                    return;
                }
                soutindex = x->gl_editor->e_selectline_index1;
                sinindex = x->gl_editor->e_selectline_index2;
                soutno = x->gl_editor->e_selectline_outno;
                sinno = x->gl_editor->e_selectline_inno;
                        /* if the hovered line is already selected, deselect it */
                if ((outindex == soutindex) && (inindex == sinindex)
                    && (soutno == t.tr_outno) && (sinno == t.tr_inno))
                {
                    if(doit)
                        glist_deselectline(x);
                    canvas_setcursor(x, CURSOR_EDITMODE_DISCONNECT);
                    return;
                }

                    /* swap selected and hovered connection */
                if ((!x->gl_editor->e_selection)
                    && ((outindex == soutindex) || (inindex == sinindex)))
                {
                    if(doit)
                    {
                        canvas_undo_add(x, UNDO_SEQUENCE_START, "reconnect", 0);
                        canvas_disconnect_with_undo(x, soutindex, soutno, sinindex, sinno);
                        canvas_disconnect_with_undo(x, outindex, t.tr_outno, inindex, t.tr_inno);
                        canvas_connect_with_undo(x, outindex, t.tr_outno, sinindex, sinno);
                        canvas_connect_with_undo(x, soutindex, soutno, inindex, t.tr_inno);
                        canvas_undo_add(x, UNDO_SEQUENCE_END, "reconnect", 0);

                        x->gl_editor->e_selectline_index1 = soutindex;
                        x->gl_editor->e_selectline_outno = soutno;
                        x->gl_editor->e_selectline_index2 = inindex;
                        x->gl_editor->e_selectline_inno = t.tr_inno;

                        canvas_dirty(x, 1);
                    }
                    canvas_setcursor(x, CURSOR_EDITMODE_DISCONNECT);
                    return;
                }
            }
            if (!shiftmod)
            {
                    /* !shiftmode: clear selection before selecting line */
                if (doit)
                {
                    glist_noselect(x);
                    glist_selectline(glist2, oc,
                        outindex, t.tr_outno,
                        inindex, t.tr_inno);
                }
                canvas_setcursor(x, CURSOR_EDITMODE_DISCONNECT);
                return;
            }
        }
    }
    canvas_setcursor(x, CURSOR_EDITMODE_NOTHING);
    if (doit)
    {
        if (!shiftmod) glist_noselect(x);
        pdgui_vmess(0, "crr iiii rs",
            x, "create", "rectangle",
            xpos,ypos, xpos,ypos,
            "-tags", "x");
        x->gl_editor->e_xwas = xpos;
        x->gl_editor->e_ywas = ypos;
        x->gl_editor->e_onmotion = MA_REGION;
    }
}